

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

GLenum gl4cts::CopyImage::Utils::transRealToBindTarget(GLenum target)

{
  GLenum local_c;
  GLenum target_local;
  
  local_c = target;
  switch(target) {
  case 0x8515:
    local_c = 0x8513;
    break;
  case 0x8516:
    local_c = 0x8513;
    break;
  case 0x8517:
    local_c = 0x8513;
    break;
  case 0x8518:
    local_c = 0x8513;
    break;
  case 0x8519:
    local_c = 0x8513;
    break;
  case 0x851a:
    local_c = 0x8513;
  }
  return local_c;
}

Assistant:

GLenum Utils::transRealToBindTarget(GLenum target)
{
	switch (target)
	{
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	default:
		break;
	}

	return target;
}